

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  long lVar2;
  Type type;
  uint32 uVar3;
  char *pcVar4;
  int in_EDX;
  FieldDescriptor *in_RSI;
  long *in_RDI;
  
  lVar1 = *in_RDI;
  lVar2 = in_RDI[1];
  pcVar4 = FieldDescriptor::index(in_RSI,(char *)in_RSI,in_EDX);
  uVar3 = *(uint32 *)(lVar2 + (long)(int)pcVar4 * 4);
  type = FieldDescriptor::type(in_RSI);
  uVar3 = OffsetValue(uVar3,type);
  return (void *)(lVar1 + (ulong)uVar3);
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }